

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitterutils_p.h
# Opt level: O0

void asmjit::v1_14::EmitterUtils::opArrayFromEmitArgs
               (Operand_ *dst,Operand_ *o0,Operand_ *o1,Operand_ *o2,Operand_ *opExt)

{
  Operand_ *opExt_local;
  Operand_ *o2_local;
  Operand_ *o1_local;
  Operand_ *o0_local;
  Operand_ *dst_local;
  
  (dst->_signature)._bits = (o0->_signature)._bits;
  dst->_baseId = o0->_baseId;
  dst->_data[0] = o0->_data[0];
  dst->_data[1] = o0->_data[1];
  dst[1]._signature._bits = (o1->_signature)._bits;
  dst[1]._baseId = o1->_baseId;
  dst[1]._data[0] = o1->_data[0];
  dst[1]._data[1] = o1->_data[1];
  dst[2]._signature._bits = (o2->_signature)._bits;
  dst[2]._baseId = o2->_baseId;
  dst[2]._data[0] = o2->_data[0];
  dst[2]._data[1] = o2->_data[1];
  dst[3]._signature._bits = (opExt->_signature)._bits;
  dst[3]._baseId = opExt->_baseId;
  dst[3]._data[0] = opExt->_data[0];
  dst[3]._data[1] = opExt->_data[1];
  dst[4]._signature._bits = opExt[1]._signature._bits;
  dst[4]._baseId = opExt[1]._baseId;
  dst[4]._data[0] = opExt[1]._data[0];
  dst[4]._data[1] = opExt[1]._data[1];
  dst[5]._signature._bits = opExt[2]._signature._bits;
  dst[5]._baseId = opExt[2]._baseId;
  dst[5]._data[0] = opExt[2]._data[0];
  dst[5]._data[1] = opExt[2]._data[1];
  return;
}

Assistant:

static ASMJIT_FORCE_INLINE void opArrayFromEmitArgs(Operand_ dst[Globals::kMaxOpCount], const Operand_& o0, const Operand_& o1, const Operand_& o2, const Operand_* opExt) noexcept {
  dst[0].copyFrom(o0);
  dst[1].copyFrom(o1);
  dst[2].copyFrom(o2);
  dst[3].copyFrom(opExt[kOp3]);
  dst[4].copyFrom(opExt[kOp4]);
  dst[5].copyFrom(opExt[kOp5]);
}